

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireEmptyHandTest_trySelectNextStockPileCard_Test::TestBody
          (SolitaireEmptyHandTest_trySelectNextStockPileCard_Test *this)

{
  FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_00;
  FunctionMocker<void_()> *this_01;
  element_type *peVar1;
  HistoryTrackerMock *this_02;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_03;
  ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *impl;
  InSequence seq;
  InSequence local_51;
  undefined1 local_50 [16];
  VTable *local_40;
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  local_30;
  StrictMock<solitaire::archivers::SnapshotMock> *local_18;
  
  testing::InSequence::InSequence(&local_51);
  peVar1 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
           super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &peVar1->gmock10_getCards_16;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,peVar1);
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)this_00;
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                        *)&local_30,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x151,"*stockPileMock","getCards()");
  impl = (ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_003240f8;
  impl[1]._vptr_ActionInterface = (_func_int **)(anonymous_namespace)::oneCard;
  testing::
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
  Action((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
          *)local_50,impl);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_03,(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)local_50);
  if (local_40 != (VTable *)0x0) {
    (*(code *)local_40)(local_50,local_50,3);
  }
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::StockPileMock>
            (&this->super_SolitaireEmptyHandTest,
             (this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
             super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &(this->super_SolitaireEmptyHandTest).snapshotMock);
  peVar1 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
           super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = &peVar1->gmock00_trySelectNextCard_14;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_01->super_UntypedFunctionMockerBase,peVar1);
  local_50._0_8_ = this_01;
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x153,"*stockPileMock","trySelectNextCard()");
  this_02 = &((this->super_SolitaireEmptyHandTest).super_SolitaireTest.historyTrackerMock.rawPointer
             )->super_HistoryTrackerMock;
  local_18 = (this->super_SolitaireEmptyHandTest).snapshotMock.rawPointer;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)&local_30,(PointerMatcher *)&local_18);
  archivers::HistoryTrackerMock::gmock_save
            ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_50,this_02,
             (Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)&local_30);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::InternalExpectedAt
            ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x154,"*historyTrackerMock","save(Pointer(snapshotMock.get()))");
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase((MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
                  *)(local_50 + 8));
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase(&local_30);
  Solitaire::trySelectNextStockPileCard
            (&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire);
  testing::InSequence::~InSequence(&local_51);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, trySelectNextStockPileCard) {
    InSequence seq;
    EXPECT_CALL(*stockPileMock, getCards()).WillOnce(ReturnRef(oneCard));
    expectSnapshotCreation(*stockPileMock, snapshotMock);
    EXPECT_CALL(*stockPileMock, trySelectNextCard());
    EXPECT_CALL(*historyTrackerMock, save(Pointer(snapshotMock.get())));

    solitaire.trySelectNextStockPileCard();
}